

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O1

void aom_dc_predictor_64x64_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint8_t *puVar5;
  undefined4 uVar6;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 auVar7 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  auVar10 = psadbw(*(undefined1 (*) [16])above,(undefined1  [16])0x0);
  auVar14 = psadbw(*(undefined1 (*) [16])(above + 0x10),(undefined1  [16])0x0);
  auVar11 = psadbw(*(undefined1 (*) [16])(above + 0x20),(undefined1  [16])0x0);
  auVar16 = psadbw(*(undefined1 (*) [16])(above + 0x30),(undefined1  [16])0x0);
  auVar12 = psadbw(*(undefined1 (*) [16])left,(undefined1  [16])0x0);
  auVar15 = psadbw(*(undefined1 (*) [16])(left + 0x10),(undefined1  [16])0x0);
  auVar13 = psadbw(*(undefined1 (*) [16])(left + 0x20),(undefined1  [16])0x0);
  auVar7 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])(left + 0x30));
  uVar2 = CONCAT22(auVar7._2_2_ + auVar13._2_2_ + auVar15._2_2_ + auVar12._2_2_ +
                   auVar16._2_2_ + auVar11._2_2_ + auVar14._2_2_ + auVar10._2_2_ +
                   auVar16._10_2_ + auVar11._10_2_ + auVar14._10_2_ + auVar10._10_2_ +
                   auVar7._10_2_ + auVar13._10_2_ + auVar15._10_2_ + auVar12._10_2_,
                   auVar7._0_2_ + auVar13._0_2_ + auVar15._0_2_ + auVar12._0_2_ +
                   auVar16._0_2_ + auVar11._0_2_ + auVar14._0_2_ + auVar10._0_2_ +
                   auVar16._8_2_ + auVar11._8_2_ + auVar14._8_2_ + auVar10._8_2_ +
                   auVar7._8_2_ + auVar13._8_2_ + auVar15._8_2_ + auVar12._8_2_) + 0x40;
  uVar3 = uVar2 >> 7;
  bVar1 = (byte)(uVar2 >> 0x18);
  uVar9 = (undefined1)(uVar3 >> 0x10);
  uVar8 = (undefined1)(uVar3 >> 8);
  auVar7._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(bVar1 >> 7,bVar1 >> 7),uVar9),
                                CONCAT14(uVar9,uVar3)) >> 0x20);
  auVar7[3] = uVar8;
  auVar7[2] = uVar8;
  auVar7[0] = (undefined1)uVar3;
  auVar7[1] = auVar7[0];
  auVar7._8_8_ = 0;
  auVar7 = pshuflw(auVar7,auVar7,0);
  uVar6 = auVar7._0_4_;
  puVar5 = dst + 0x30;
  iVar4 = 0x40;
  do {
    *(undefined4 *)(puVar5 + -0x30) = uVar6;
    *(undefined4 *)(puVar5 + -0x2c) = uVar6;
    *(undefined4 *)(puVar5 + -0x28) = uVar6;
    *(undefined4 *)(puVar5 + -0x24) = uVar6;
    *(undefined4 *)(puVar5 + -0x20) = uVar6;
    *(undefined4 *)(puVar5 + -0x1c) = uVar6;
    *(undefined4 *)(puVar5 + -0x18) = uVar6;
    *(undefined4 *)(puVar5 + -0x14) = uVar6;
    *(undefined4 *)(puVar5 + -0x10) = uVar6;
    *(undefined4 *)(puVar5 + -0xc) = uVar6;
    *(undefined4 *)(puVar5 + -8) = uVar6;
    *(undefined4 *)(puVar5 + -4) = uVar6;
    *(undefined4 *)puVar5 = uVar6;
    *(undefined4 *)(puVar5 + 4) = uVar6;
    *(undefined4 *)(puVar5 + 8) = uVar6;
    *(undefined4 *)(puVar5 + 0xc) = uVar6;
    puVar5 = puVar5 + stride;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  return;
}

Assistant:

static inline __m128i dc_sum_64(const uint8_t *ref) {
  __m128i x0 = _mm_load_si128((__m128i const *)ref);
  __m128i x1 = _mm_load_si128((__m128i const *)(ref + 16));
  __m128i x2 = _mm_load_si128((__m128i const *)(ref + 32));
  __m128i x3 = _mm_load_si128((__m128i const *)(ref + 48));
  const __m128i zero = _mm_setzero_si128();
  x0 = _mm_sad_epu8(x0, zero);
  x1 = _mm_sad_epu8(x1, zero);
  x2 = _mm_sad_epu8(x2, zero);
  x3 = _mm_sad_epu8(x3, zero);
  x0 = _mm_add_epi16(x0, x1);
  x2 = _mm_add_epi16(x2, x3);
  x0 = _mm_add_epi16(x0, x2);
  const __m128i high = _mm_unpackhi_epi64(x0, x0);
  return _mm_add_epi16(x0, high);
}